

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall
QPDFJob::PageSpec::PageSpec(PageSpec *this,string *filename,char *password,string *range)

{
  allocator<char> local_51;
  __shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> local_50;
  string local_40;
  
  std::__cxx11::string::string((string *)this,(string *)filename);
  (this->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&this->range,(string *)range);
  if (password != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,password,&local_51);
    QUtil::make_shared_cstr((QUtil *)&local_50,&local_40);
    std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>,&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

QPDFJob::PageSpec::PageSpec(
    std::string const& filename, char const* password, std::string const& range) :
    filename(filename),
    range(range)
{
    if (password) {
        this->password = QUtil::make_shared_cstr(password);
    }
}